

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O3

void __thiscall WriterTest_WriteLongDouble_Test::TestBody(WriterTest_WriteLongDouble_Test *this)

{
  bool bVar1;
  longdouble *in_RDX;
  longdouble *extraout_RDX_00;
  longdouble *value;
  longdouble *value_00;
  char *pcVar2;
  format_args args;
  string_view format_str;
  AssertionResult gtest_ar_2;
  wstring str;
  Message local_78;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sStack_70;
  longdouble local_68;
  AssertHelper local_50;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_48;
  longdouble local_28;
  unkbyte10 local_1c;
  longdouble *extraout_RDX;
  
  local_1c = _DAT_00235030;
  local_78.ss_.ptr_._0_4_ = (undefined4)_DAT_00235030;
  local_78.ss_.ptr_._4_4_ = (undefined4)((unkuint10)_DAT_00235030 >> 0x20);
  sStack_70.ptr_._0_2_ = (undefined2)((unkuint10)_DAT_00235030 >> 0x40);
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_48,(char *)&local_78,in_RDX);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_78);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x28a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28 = _DAT_00235040;
  local_78.ss_.ptr_._0_4_ = SUB104(_DAT_00235040,0);
  local_78.ss_.ptr_._4_4_ = (undefined4)((unkuint10)_DAT_00235040 >> 0x20);
  sStack_70.ptr_._0_2_ = (undefined2)((unkuint10)_DAT_00235040 >> 0x40);
  (anonymous_namespace)::check_write<char,long_double>((longdouble *)&local_48,(char *)&local_78);
  if ((char)local_48._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_78);
    if ((undefined8 *)local_48._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_48._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x28b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_68,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_68);
    if (CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_78.ss_.ptr_._4_4_,local_78.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_48._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = L'\0';
  local_78.ss_.ptr_._0_4_ = (undefined4)local_1c;
  local_78.ss_.ptr_._4_4_ = (undefined4)((unkuint10)local_1c >> 0x20);
  sStack_70.ptr_._0_2_ = (undefined2)((unkuint10)local_1c >> 0x40);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  (anonymous_namespace)::std_format<wchar_t,long_double>((longdouble *)&local_78,&local_48);
  if (*local_48._M_dataplus._M_p == L'-') {
    local_78.ss_.ptr_._0_4_ = 0;
    args.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .field_1.values_ =
         (value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
          *)&local_78;
    args.
    super_basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    .types_ = fmt::v5::
              format_arg_store<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
              ::TYPES;
    format_str.size_ = 0x3c;
    format_str.data_ = "warning: long double formatting with std::swprintf is broken";
    fmt::v5::vprint(format_str,args);
    value = extraout_RDX;
  }
  else {
    local_68 = local_28;
    (anonymous_namespace)::check_write<wchar_t,long_double>
              ((_anonymous_namespace_ *)&local_78,&local_68,"char");
    if (local_78.ss_.ptr_._0_1_ == (_anonymous_namespace_)0x0) {
      testing::Message::Message((Message *)&local_68);
      if ((undefined8 *)CONCAT62(sStack_70.ptr_._2_6_,sStack_70.ptr_._0_2_) == (undefined8 *)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)CONCAT62(sStack_70.ptr_._2_6_,sStack_70.ptr_._0_2_);
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
                 ,0x28f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if (local_68._0_8_ != (AssertHelperData *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && (local_68._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_68._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    value = extraout_RDX_00;
  }
  local_68 = _DAT_00235050;
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_78,(char *)&local_68,value);
  if (local_78.ss_.ptr_._0_1_ == (_anonymous_namespace_)0x0) {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)CONCAT62(sStack_70.ptr_._2_6_,sStack_70.ptr_._0_2_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT62(sStack_70.ptr_._2_6_,sStack_70.ptr_._0_2_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x292,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_68._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_68 = _DAT_00235060;
  (anonymous_namespace)::AnyWriteChecker::operator()(&local_78,(char *)&local_68,value_00);
  if (local_78.ss_.ptr_._0_1_ == (_anonymous_namespace_)0x0) {
    testing::Message::Message((Message *)&local_68);
    if ((undefined8 *)CONCAT62(sStack_70.ptr_._2_6_,sStack_70.ptr_._0_2_) == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)CONCAT62(sStack_70.ptr_._2_6_,sStack_70.ptr_._0_2_);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/format-test.cc"
               ,0x293,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    if (local_68._0_8_ != (AssertHelperData *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_68._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_68._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&sStack_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(WriterTest, WriteLongDouble) {
  CHECK_WRITE(4.2l);
  CHECK_WRITE_CHAR(-4.2l);
  std::wstring str;
  std_format(4.2l, str);
  if (str[0] != '-')
    CHECK_WRITE_WCHAR(-4.2l);
  else
    fmt::print("warning: long double formatting with std::swprintf is broken");
  CHECK_WRITE(std::numeric_limits<long double>::min());
  CHECK_WRITE(std::numeric_limits<long double>::max());
}